

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_butcher.c
# Opt level: O2

int arkode_butcher_order6a
              (sunrealtype *b,sunrealtype *c1,sunrealtype *c2,sunrealtype *c3,sunrealtype *c4,
              sunrealtype *c5,int s)

{
  int iVar1;
  sunrealtype *z;
  sunrealtype *z_00;
  sunrealtype bccccc;
  
  z = (sunrealtype *)calloc((long)s,8);
  z_00 = (sunrealtype *)calloc((long)s,8);
  iVar1 = arkode_butcher_vv(c1,c2,s,z);
  if ((((iVar1 == 0) && (iVar1 = arkode_butcher_vv(c3,z,s,z_00), iVar1 == 0)) &&
      (iVar1 = arkode_butcher_vv(c4,z_00,s,z), iVar1 == 0)) &&
     (iVar1 = arkode_butcher_vv(c5,z,s,z_00), iVar1 == 0)) {
    iVar1 = arkode_butcher_dot(b,z_00,s,&bccccc);
    if (iVar1 != 0) {
      return 0;
    }
    free(z);
    free(z_00);
    return (uint)(ABS(bccccc + -0.16666666666666666) <= 1.4901161193847656e-08);
  }
  free(z);
  free(z_00);
  return 0;
}

Assistant:

static sunbooleantype arkode_butcher_order6a(sunrealtype* b, sunrealtype* c1,
                                             sunrealtype* c2, sunrealtype* c3,
                                             sunrealtype* c4, sunrealtype* c5,
                                             int s)
{
  sunrealtype bccccc;
  sunrealtype* tmp1 = calloc(s, sizeof(sunrealtype));
  sunrealtype* tmp2 = calloc(s, sizeof(sunrealtype));
  if (arkode_butcher_vv(c1, c2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c3, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c4, tmp2, s, tmp1))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_vv(c5, tmp1, s, tmp2))
  {
    free(tmp1);
    free(tmp2);
    return (SUNFALSE);
  }
  if (arkode_butcher_dot(b, tmp2, s, &bccccc)) { return (SUNFALSE); }
  free(tmp1);
  free(tmp2);
  return (SUNRabs(bccccc - SUN_RCONST(1.0) / SUN_RCONST(6.0)) > TOL) ? SUNFALSE
                                                                     : SUNTRUE;
}